

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t __thiscall
icu_63::MessagePattern::parseChoiceStyle
          (MessagePattern *this,int32_t index,int32_t nestingLevel,UParseError *parseError,
          UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  uint uVar3;
  uint uVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  UErrorCode local_48;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar3 = skipWhiteSpace(this,index);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  local_48 = U_PATTERN_SYNTAX_ERROR;
  if (uVar3 == uVar4) {
LAB_002a1095:
    index = 0;
  }
  else {
    if (uVar3 < uVar4) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar5 = (this->msg).fUnion.fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&(this->msg).fUnion + 2);
      }
      if (pcVar5[(int)uVar3] == L'}') goto LAB_002a1095;
    }
    uVar4 = skipDouble(this,uVar3);
    if (uVar4 != uVar3) {
      pcVar5 = (char16_t *)((long)&(this->msg).fUnion + 2);
      do {
        if (0xffff < (int)(uVar4 - uVar3)) {
          local_48 = U_INDEX_OUTOFBOUNDS_ERROR;
          index = uVar3;
          break;
        }
        parseDouble(this,uVar3,uVar4,'\x01',parseError,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return 0;
        }
        uVar3 = skipWhiteSpace(this,uVar4);
        sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar4 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          uVar4 = (int)sVar1 >> 5;
        }
        if (uVar4 <= uVar3) break;
        pcVar6 = pcVar5;
        if (((int)sVar1 & 2U) == 0) {
          pcVar6 = (this->msg).fUnion.fFields.fArray;
        }
        cVar2 = pcVar6[(int)uVar3];
        if (((cVar2 != L'#') && (cVar2 != L'≤')) && (cVar2 != L'<')) break;
        addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,uVar3,1,0,errorCode);
        uVar3 = parseMessage(this,uVar3 + 1,0,nestingLevel + 1,UMSGPAT_ARG_TYPE_CHOICE,parseError,
                             errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return 0;
        }
        sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar4 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          uVar4 = (int)sVar1 >> 5;
        }
        if (uVar3 == uVar4) {
          return uVar3;
        }
        if (uVar3 < uVar4) {
          pcVar6 = pcVar5;
          if (((int)sVar1 & 2U) == 0) {
            pcVar6 = (this->msg).fUnion.fFields.fArray;
          }
          if (pcVar6[(int)uVar3] == L'}') {
            if (0 < nestingLevel) {
              return uVar3;
            }
            if (((this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr
                )->type == UMSGPAT_PART_TYPE_MSG_START) {
              return uVar3;
            }
            break;
          }
        }
        uVar3 = skipWhiteSpace(this,uVar3 + 1);
        uVar4 = skipDouble(this,uVar3);
      } while (uVar4 != uVar3);
    }
  }
  setParseError(this,parseError,index);
  *errorCode = local_48;
  return 0;
}

Assistant:

int32_t
MessagePattern::parseChoiceStyle(int32_t index, int32_t nestingLevel,
                                 UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    index=skipWhiteSpace(index);
    if(index==msg.length() || msg.charAt(index)==u_rightCurlyBrace) {
        setParseError(parseError, 0);  // Missing choice argument pattern.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    }
    for(;;) {
        // The choice argument style contains |-separated (number, separator, message) triples.
        // Parse the number.
        int32_t numberIndex=index;
        index=skipDouble(index);
        int32_t length=index-numberIndex;
        if(length==0) {
            setParseError(parseError, start);  // Bad choice pattern syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, numberIndex);  // Choice number too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        parseDouble(numberIndex, index, TRUE, parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        // Parse the separator.
        index=skipWhiteSpace(index);
        if(index==msg.length()) {
            setParseError(parseError, start);  // Bad choice pattern syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        UChar c=msg.charAt(index);
        if(!(c==u_pound || c==u_lessThan || c==u_lessOrEqual)) {  // U+2264 is <=
            setParseError(parseError, start);  // Expected choice separator (#<\u2264) instead of c.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, index, 1, 0, errorCode);
        // Parse the message fragment.
        index=parseMessage(++index, 0, nestingLevel+1, UMSGPAT_ARG_TYPE_CHOICE, parseError, errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        // parseMessage(..., CHOICE) returns the index of the terminator, or msg.length().
        if(index==msg.length()) {
            return index;
        }
        if(msg.charAt(index)==u_rightCurlyBrace) {
            if(!inMessageFormatPattern(nestingLevel)) {
                setParseError(parseError, start);  // Bad choice pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            return index;
        }  // else the terminator is '|'
        index=skipWhiteSpace(index+1);
    }
}